

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

int __thiscall CVmBifTADS::rand(CVmBifTADS *this)

{
  int iVar1;
  int extraout_EAX;
  uint32_t uVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  vm_val_t *pvVar3;
  char *pcVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long *plVar7;
  vm_val_t val;
  vm_val_t ret;
  err_frame_t err_cur__;
  RandStrParser *rsp;
  size_t tplbytes;
  char *tpl;
  ulong rand_val;
  int choose_an_ele;
  int choose_an_arg;
  int use_range;
  int32_t range;
  vm_val_t *in_stack_fffffffffffffe98;
  RandStrParser *in_stack_fffffffffffffea0;
  undefined8 uVar8;
  vm_val_t *in_stack_fffffffffffffea8;
  vm_val_t *in_stack_fffffffffffffeb0;
  vm_val_t *in_stack_fffffffffffffeb8;
  anon_union_8_8_cb74652f_for_val in_stack_fffffffffffffec0;
  vm_val_t *in_stack_fffffffffffffec8;
  RandStrParser *in_stack_fffffffffffffed0;
  uint local_128 [2];
  undefined8 local_120;
  void *local_118;
  __jmp_buf_tag _Stack_110;
  void *local_38;
  size_t local_30;
  char *local_28;
  ulong local_20;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_4 = (int)this;
  local_10 = 0;
  local_14 = 0;
  if (local_4 == 0) {
    local_c = 0;
    goto LAB_002a417a;
  }
  if ((local_4 == 1) && (pvVar3 = CVmStack::get(0), pvVar3->typ == VM_INT)) {
    pvVar3 = CVmStack::get(0);
    local_8 = (pvVar3->val).intval;
    local_c = 1;
    CVmStack::discard();
    goto LAB_002a417a;
  }
  if (local_4 == 1) {
    CVmStack::get(0);
    iVar1 = vm_val_t::is_listlike(in_stack_fffffffffffffeb0);
    if (iVar1 == 0) goto LAB_002a3f66;
    CVmStack::get(0);
    local_8 = vm_val_t::ll_length(in_stack_fffffffffffffea8);
    if (local_8 < 0) goto LAB_002a3f66;
    local_14 = 1;
  }
  else {
LAB_002a3f66:
    if (local_4 == 1) {
      CVmStack::get(0);
      pcVar4 = vm_val_t::get_as_string(in_stack_fffffffffffffe98);
      if (pcVar4 != (char *)0x0) {
        CVmStack::get(0);
        local_28 = vm_val_t::get_as_string(in_stack_fffffffffffffe98);
        local_30 = vmb_get_len((char *)0x2a3fb5);
        local_28 = local_28 + 2;
        pvVar5 = operator_new(0x18);
        RandStrParser::RandStrParser
                  ((RandStrParser *)in_stack_fffffffffffffec0.native_desc,
                   (char *)in_stack_fffffffffffffeb8,(size_t)pvVar5);
        local_38 = pvVar5;
        puVar6 = (undefined8 *)_ZTW11G_err_frame();
        local_120 = *puVar6;
        plVar7 = (long *)_ZTW11G_err_frame();
        *plVar7 = (long)local_128;
        local_128[0] = _setjmp(&_Stack_110);
        if (local_128[0] == 0) {
          RandStrParser::exec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          CVmBif::retval((vm_val_t *)in_stack_fffffffffffffea0);
        }
        if (((local_128[0] & 0x8000) == 0) &&
           (local_128[0] = local_128[0] | 0x8000, local_38 != (void *)0x0)) {
          pvVar5 = local_38;
          RandStrParser::~RandStrParser(in_stack_fffffffffffffea0);
          operator_delete(pvVar5,0x18);
        }
        uVar8 = local_120;
        puVar6 = (undefined8 *)_ZTW11G_err_frame();
        *puVar6 = uVar8;
        if ((local_128[0] & 0x4001) != 0) {
          puVar6 = (undefined8 *)_ZTW11G_err_frame();
          if ((*(uint *)*puVar6 & 2) != 0) {
            plVar7 = (long *)_ZTW11G_err_frame();
            free(*(void **)(*plVar7 + 0x10));
          }
          pvVar5 = local_118;
          plVar7 = (long *)_ZTW11G_err_frame();
          *(void **)(*plVar7 + 0x10) = pvVar5;
          err_rethrow();
        }
        if ((local_128[0] & 2) != 0) {
          free(local_118);
        }
        CVmStack::discard();
        return extraout_EAX;
      }
    }
    local_8 = local_4;
    local_10 = 1;
  }
  local_c = 1;
LAB_002a417a:
  iVar1 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  uVar2 = rng_next();
  local_20 = (ulong)uVar2;
  if (local_c != 0) {
    local_20 = rand_range(local_20,(long)local_8);
  }
  if (local_10 == 0) {
    if (local_14 == 0) {
      CVmBif::retval_int(0x2a4242);
      iVar1 = extraout_EAX_02;
    }
    else {
      if (local_8 == 0) {
        vm_val_t::set_nil((vm_val_t *)&stack0xfffffffffffffeb8);
      }
      else {
        CVmStack::get(0);
        vm_val_t::ll_index((vm_val_t *)in_stack_fffffffffffffec0.native_desc,
                           in_stack_fffffffffffffeb8,iVar1);
      }
      CVmBif::retval((vm_val_t *)in_stack_fffffffffffffea0);
      CVmStack::discard();
      iVar1 = extraout_EAX_01;
    }
  }
  else {
    CVmStack::get((long)(int)local_20);
    CVmBif::retval((vm_val_t *)in_stack_fffffffffffffea0);
    CVmStack::discard(local_4);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void CVmBifTADS::rand(VMG_ uint argc)
{
    int32_t range;
    int use_range;
    int choose_an_arg = FALSE;
    int choose_an_ele = FALSE;
    ulong rand_val;

    /* determine the desired range of values based on the arguments */
    if (argc == 0)
    {
        /* 
         *   if no argument is given, produce a random number in our full
         *   range - clear the 'use_range' flag to so indicate
         */
        use_range = FALSE;
    }
    else if (argc == 1 && G_stk->get(0)->typ == VM_INT)
    {
        /* we're returning a number in the range 0..(arg-1) */
        range = G_stk->get(0)->val.intval;
        use_range = TRUE;

        /* discard the argument */
        G_stk->discard();
    }
    else if (argc == 1
             && G_stk->get(0)->is_listlike(vmg0_)
             && (range = G_stk->get(0)->ll_length(vmg0_)) >= 0)
    {
        /* use the range of 1..length */
        use_range = TRUE;

        /* note that we're choosing from a list-like object */
        choose_an_ele = TRUE;

        /* note - leave the object on the stack as gc protection */
    }
    else if (argc == 1
             && G_stk->get(0)->get_as_string(vmg0_) != 0)
    {
        /* 
         *   It's a string, giving a template for generating a new random
         *   string.  First, get the string argument.  
         */
        const char *tpl = G_stk->get(0)->get_as_string(vmg0_);
        size_t tplbytes = vmb_get_len(tpl);
        tpl += VMB_LEN;

#if 1
        /* parse it */
        RandStrParser *rsp = new RandStrParser(tpl, tplbytes);

        err_try
        {
            /* generate the string */
            vm_val_t ret;
            rsp->exec(vmg_ &ret);

            /* return it */
            retval(vmg_ &ret);
        }
        err_finally
        {
            /* delete our parser on the way out */
            delete rsp;
        }
        err_end;
        
#else
        /* figure its character length */
        utf8_ptr tplp((char *)tpl);
        size_t tplchars = tplp.len(tplbytes);

        /* allocate temporary space for the result, as wide characters */
        wchar_t *buf = new wchar_t[tplchars], *dst;

        /* run through the template and generate random characters */
        for (dst = buf ; tplbytes != 0 ; )
        {
            /* generate a random number for this character */
            rand_val = rng_next(vmg0_);

            /* get and skip the next template character */
            wchar_t tch = tplp.getch();
            tplp.inc(&tplbytes);

            /* translate the template character */
            wchar_t ch;
            switch (tch)
            {
            case '.':
                /* printable ASCII character 32-126 */
                ch = (wchar_t)rand_range(rand_val, 32, 126);
                break;

            case '?':
                /* printable Latin-1 character 32-126, 160-255 */
                ch = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;

            case '*':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    ch = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);

                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;

                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;

            case '9':
                /* digit 0-9 */
                ch = (wchar_t)rand_range(rand_val, '0', '9');
                break;

            case 'X':
                /* upper-case hex digit 0-9 A-F */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;

            case 'x':
                /* lower-case hex digit 0-9 a-f */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;

            case 'A':
                /* letter A-Z */
                ch = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;

            case 'a':
                /* letter a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;

            case 'b':
                /* random byte value 0-255 */
                ch = (wchar_t)rand_range(rand_val, 0, 255);
                break;

            case 'c':
                /* mixed-case letter A-Z a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;

            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                ch = (wchar_t)rand_range(rand_val,
                                         '0', '9', 'a', 'z', 'A', 'Z');
                break;

            case '[':
                /* 
                 *   Character range.  Scan the range to count the number of
                 *   characters included.  
                 */
                {
                    /* 
                     *   allocate a list of range descriptors - use 'len2' as
                     *   the range count, since at the most we could have one
                     *   range per byte (but it'll usually be less) 
                     */
                    struct rdesc
                    {
                        int set(wchar_t c)
                        {
                            start = end = c;
                            return 1;
                        }
                        int set(wchar_t a, wchar_t b)
                        {
                            if (b > a)
                                start = a, end = b;
                            else
                                start = b, end = a;
                            return end - start + 1;
                        }
                        wchar_t start;
                        wchar_t end;
                    };
                    rdesc *ranges = new rdesc[tplbytes];
                    int nranges = 0, nchars = 0;

                    /* scan for the closing ']' */
                    for ( ; tplbytes != 0 && tplp.getch() != ']' ;
                          tplp.inc(&tplbytes))
                    {
                        /* check for escapes */
                        wchar_t rch = tplp.getch();
                        if (rch == '%')
                        {
                            tplp.inc(&tplbytes);
                            rch = tplp.getch();
                        }
                        
                        /* if the next character is '-', it's a range */
                        if (tplbytes > 1 && tplp.getch_at(1) == '-')
                        {
                            /* skip the current character and the '-' */
                            tplp.inc(&tplbytes);
                            tplp.inc(&tplbytes);

                            /* if the next character is quoted, skip the % */
                            if (tplbytes > 1 && tplp.getch() == '%')
                                tplp.inc(&tplbytes);

                            /* 
                             *   The range count includes everything from
                             *   'rch' to the current character.  
                             */
                            if (tplbytes != 0)
                                nchars += ranges[nranges++].set(
                                    rch, tplp.getch());
                        }
                        else
                        {
                            /* it's a single character range */
                            nchars += ranges[nranges++].set(rch);
                        }
                        
                        /* if we're out of characters, we're done */
                        if (tplbytes == 0)
                            break;
                    }

                    /* pick a number from 0 to rcnt */
                    ch = (wchar_t)rand_range(rand_val, nchars);

                    /* find the character */
                    for (int i = 0 ; i < nranges ; ++i)
                    {
                        /* if it's in the current range, apply it */
                        const rdesc *r = &ranges[i];
                        if (ch <= r->end - r->start)
                        {
                            ch += r->start;
                            break;
                        }

                        /* 
                         *   it's not in this range, so deduct the range
                         *   length from the remainder and keep going 
                         */
                        ch -= r->end - r->start + 1;
                    }

                    /* done with the range list */
                    delete [] ranges;

                    /* skip the closing ']' */
                    if (tplbytes != 0 && tplp.getch() == ']')
                        tplp.inc(&tplbytes);
                }
                break;

            case '%':
                /* copy the next character unchanged */
                if (tplbytes != 0)
                {
                    ch = tplp.getch();
                    tplp.inc(&tplbytes);
                }
                else
                    ch = '%';
                break;

            default:
                /* no character */
                continue;
            }

            /* save it in our temp buffer, and note its utf8 size */
            *dst++ = ch;
        }

        /* convert the temp buffer to a real string */
        retval_obj(vmg_ CVmObjString::create(vmg_ FALSE, buf, dst - buf));

        /* done with the temporary buffer */
        delete [] buf;
#endif
        
        /* discard the argument */
        G_stk->discard();

        /* we're done */
        return;
    }
    else
    {
        /* 
         *   produce a random number in the range 0..(argc-1) so that we
         *   can select one of our arguments 
         */
        range = argc;
        use_range = TRUE;

        /* note that we should choose an argument value */
        choose_an_arg = TRUE;
    }

    /* get the next random number */
    rand_val = rng_next(vmg0_);

    /*
     *   Calculate our random value in the range 0..(range-1).  If range
     *   == 0, simply choose a value across our full range.  
     */
    if (use_range)
        rand_val = rand_range(rand_val, range);

    /*
     *   Return the appropriate value, depending on our argument list 
     */
    if (choose_an_arg)
    {
        /* return the selected argument */
        retval(vmg_ G_stk->get((int)rand_val));

        /* discard all of the arguments */
        G_stk->discard(argc);
    }
    else if (choose_an_ele)
    {
        vm_val_t val;

        /* get the selected element */
        if (range == 0)
        {
            /* there are no elements to choose from, so return nil */
            val.set_nil();
        }
        else
        {
            /* get the selected list element */
            G_stk->get(0)->ll_index(vmg_ &val, rand_val + 1);
        }

        /* set the result */
        retval(vmg_ &val);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* simply return the random number */
        retval_int(vmg_ (long)rand_val);
    }
}